

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasinterval.cpp
# Opt level: O3

BOOL __thiscall LASinterval::merge(LASinterval *this,BOOL erase)

{
  U32 *pUVar1;
  _Rb_tree_color _Var2;
  U32 UVar3;
  LASintervalCell *pLVar4;
  void *pvVar5;
  _Base_ptr p_Var6;
  BOOL BVar7;
  LASintervalCell *pLVar8;
  LASintervalStartCell *pLVar9;
  _Rb_tree_node_base *p_Var10;
  LASintervalStartCell *this_00;
  int iVar11;
  _Self __tmp;
  my_cell_map map;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_LASintervalCell_*>,_std::_Select1st<std::pair<const_unsigned_int,_LASintervalCell_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
  local_70;
  pair<const_unsigned_int,_LASintervalCell_*> local_40;
  
  pLVar9 = this->merged_cells;
  if (pLVar9 != (LASintervalStartCell *)0x0) {
    if (this->merged_cells_temporary == true) {
      pLVar8 = (pLVar9->super_LASintervalCell).next;
      if (pLVar8 != (LASintervalCell *)0x0) {
        do {
          pLVar4 = pLVar8->next;
          operator_delete(pLVar8);
          pLVar8 = pLVar4;
        } while (pLVar4 != (LASintervalCell *)0x0);
        pLVar9 = this->merged_cells;
      }
      operator_delete(pLVar9);
    }
    this->merged_cells = (LASintervalStartCell *)0x0;
  }
  pvVar5 = this->cells_to_merge;
  if ((pvVar5 == (void *)0x0) || (*(long *)((long)pvVar5 + 0x28) == 0)) {
    BVar7 = false;
  }
  else {
    if (*(long *)((long)pvVar5 + 0x28) == 1) {
      this->merged_cells_temporary = false;
      pLVar9 = *(LASintervalStartCell **)(*(long *)((long)pvVar5 + 0x18) + 0x20);
      this->merged_cells = pLVar9;
    }
    else {
      this->merged_cells_temporary = true;
      pLVar9 = (LASintervalStartCell *)operator_new(0x20);
      LASintervalStartCell::LASintervalStartCell(pLVar9);
      this->merged_cells = pLVar9;
      local_70._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_70._M_impl.super__Rb_tree_header._M_header;
      local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Var10 = *(_Rb_tree_node_base **)((long)this->cells_to_merge + 0x18);
      local_70._M_impl.super__Rb_tree_header._M_header._M_right =
           local_70._M_impl.super__Rb_tree_header._M_header._M_left;
      if (p_Var10 != (_Rb_tree_node_base *)((long)this->cells_to_merge + 8)) {
        do {
          pLVar8 = *(LASintervalCell **)(p_Var10 + 1);
          pUVar1 = &this->merged_cells->full;
          *pUVar1 = *pUVar1 + pLVar8[1].start;
          do {
            local_40.first = pLVar8->start;
            local_40.second = pLVar8;
            std::
            _Rb_tree<unsigned_int,std::pair<unsigned_int_const,LASintervalCell*>,std::_Select1st<std::pair<unsigned_int_const,LASintervalCell*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,LASintervalCell*>>>
            ::_M_insert_equal<std::pair<unsigned_int_const,LASintervalCell*>>
                      ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,LASintervalCell*>,std::_Select1st<std::pair<unsigned_int_const,LASintervalCell*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,LASintervalCell*>>>
                        *)&local_70,&local_40);
            pLVar8 = pLVar8->next;
          } while (pLVar8 != (LASintervalCell *)0x0);
          pvVar5 = this->cells_to_merge;
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
        } while (p_Var10 != (_Rb_tree_node_base *)((long)pvVar5 + 8));
      }
      p_Var6 = local_70._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,LASintervalCell*>,std::_Select1st<std::pair<unsigned_int_const,LASintervalCell*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,LASintervalCell*>>>
      ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,LASintervalCell*>,std::_Select1st<std::pair<unsigned_int_const,LASintervalCell*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,LASintervalCell*>>>
                          *)&local_70,
                         (iterator)local_70._M_impl.super__Rb_tree_header._M_header._M_left);
      _Var2 = p_Var6->_M_color;
      pLVar9 = this->merged_cells;
      (pLVar9->super_LASintervalCell).start = _Var2;
      UVar3 = *(U32 *)&p_Var6->field_0x4;
      (pLVar9->super_LASintervalCell).end = UVar3;
      pLVar9->total = (UVar3 - _Var2) + 1;
      if (erase) {
        operator_delete(p_Var6);
      }
      if (local_70._M_impl.super__Rb_tree_header._M_node_count != 0) {
        pLVar9 = this->merged_cells;
        do {
          p_Var6 = local_70._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent;
          std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,LASintervalCell*>,std::_Select1st<std::pair<unsigned_int_const,LASintervalCell*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,LASintervalCell*>>>
          ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,LASintervalCell*>,std::_Select1st<std::pair<unsigned_int_const,LASintervalCell*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,LASintervalCell*>>>
                              *)&local_70,
                             (iterator)local_70._M_impl.super__Rb_tree_header._M_header._M_left);
          UVar3 = (pLVar9->super_LASintervalCell).end;
          if ((int)this->threshold < (int)(p_Var6->_M_color - UVar3)) {
            this_00 = (LASintervalStartCell *)operator_new(0x10);
            LASintervalCell::LASintervalCell((LASintervalCell *)this_00,(LASintervalCell *)p_Var6);
            (pLVar9->super_LASintervalCell).next = (LASintervalCell *)this_00;
            this->merged_cells->total =
                 (*(U32 *)&p_Var6->field_0x4 - p_Var6->_M_color) + this->merged_cells->total + 1;
            pLVar9 = this_00;
          }
          else {
            iVar11 = *(U32 *)&p_Var6->field_0x4 - UVar3;
            if (0 < iVar11) {
              (pLVar9->super_LASintervalCell).end = *(U32 *)&p_Var6->field_0x4;
              pUVar1 = &this->merged_cells->total;
              *pUVar1 = *pUVar1 + iVar11;
            }
            this->number_intervals = this->number_intervals - 1;
          }
          if (erase) {
            operator_delete(p_Var6);
          }
        } while (local_70._M_impl.super__Rb_tree_header._M_node_count != 0);
      }
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_LASintervalCell_*>,_std::_Select1st<std::pair<const_unsigned_int,_LASintervalCell_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
      ::~_Rb_tree(&local_70);
      pLVar9 = this->merged_cells;
    }
    this->current_cell = &pLVar9->super_LASintervalCell;
    UVar3 = pLVar9->total;
    this->full = pLVar9->full;
    this->total = UVar3;
    BVar7 = true;
  }
  return BVar7;
}

Assistant:

BOOL LASinterval::merge(const BOOL erase)
{
  // maybe delete temporary merge cells from the previous merge
  if (merged_cells)
  {
    if (merged_cells_temporary)
    {
      LASintervalCell* next_next;
      LASintervalCell* next = merged_cells->next;
      while (next)
      {
        next_next = next->next;
        delete next;
        next = next_next;
      }
      delete merged_cells;
    }
    merged_cells = 0;
  }
  // are there cells to merge
  if (cells_to_merge == 0) return FALSE;
  if (((my_cell_set*)cells_to_merge)->size() == 0) return FALSE;
  // is there just one cell
  if (((my_cell_set*)cells_to_merge)->size() == 1)
  {
    merged_cells_temporary = FALSE;
    // simply use this cell as the merge cell
    my_cell_set::iterator set_element = ((my_cell_set*)cells_to_merge)->begin();
    merged_cells = (*set_element);
  }
  else
  {
    merged_cells_temporary = TRUE;
    merged_cells = new LASintervalStartCell();
    // iterate over all cells and add their intervals to map
    LASintervalCell* cell;
    my_cell_map map;
    my_cell_set::iterator set_element = ((my_cell_set*)cells_to_merge)->begin();
#pragma warning(push)
#pragma warning(disable : 6011)
    while (true)
    {
      if (set_element == ((my_cell_set*)cells_to_merge)->end()) break;
      cell = (*set_element);
      merged_cells->full += ((LASintervalStartCell*)cell)->full;
      while (cell)
      {
        map.insert(my_cell_map::value_type(cell->start, cell));
        cell = cell->next;
      }
      set_element++;
    }
#pragma warning(pop)
    // initialize merged_cells with first interval
    my_cell_map::iterator map_element = map.begin();
    cell = (*map_element).second;
    map.erase(map_element);
    merged_cells->start = cell->start;
    merged_cells->end = cell->end;
    merged_cells->total = cell->end - cell->start + 1;
    if (erase) delete cell;
    // merge intervals
    LASintervalCell* last_cell = merged_cells;
    I32 diff;
    while (map.size())
    {
      map_element = map.begin();
      cell = (*map_element).second;
      map.erase(map_element);
      diff = cell->start - last_cell->end;
      if (diff > (I32)threshold)
      {
        last_cell->next = new LASintervalCell(cell);
        last_cell = last_cell->next;
        merged_cells->total += (cell->end - cell->start + 1);
      }
      else
      {
        diff = cell->end - last_cell->end;
        if (diff > 0)
        {
          last_cell->end = cell->end;
          merged_cells->total += diff;
        }
        number_intervals--;
      }
      if (erase) delete cell;
    }
  }
  current_cell = merged_cells;
  full = merged_cells->full;
  total = merged_cells->total;
  return TRUE;
}